

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void handle_static_file_request
               (mg_connection *conn,char *path,mg_file *filep,char *mime_type,
               char *additional_headers)

{
  mg_file_access *filep_00;
  mg_domain_context *pmVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  bool bVar6;
  mg_file *filep_01;
  char *pcVar7;
  mg_file_stat *filep_02;
  time_t *extraout_RDX;
  undefined8 extraout_RDX_00;
  time_t *t;
  time_t *extraout_RDX_01;
  char *pcVar8;
  char *local_11a8;
  int truncated;
  int64_t r1;
  size_t local_1180;
  char *local_1178;
  char *local_1170;
  int64_t r2;
  int trunc;
  char lm [64];
  char len [32];
  char range [128];
  char etag [64];
  char gz_path [4096];
  
  pmVar1 = conn->dom_ctx;
  bVar6 = filep == (mg_file *)0x0 || pmVar1 == (mg_domain_context *)0x0;
  filep_01 = (mg_file *)CONCAT71((int7)((ulong)mime_type >> 8),bVar6);
  if (bVar6) {
    return;
  }
  local_1170 = additional_headers;
  iVar2 = strcmp((conn->request_info).request_method,"HEAD");
  if (mime_type == (char *)0x0) {
    sVar4 = strlen(path);
    pcVar8 = pmVar1->config[0x26];
    do {
      pcVar8 = next_option(pcVar8,(vec *)gz_path,(vec *)range);
      if (pcVar8 == (char *)0x0) {
        mime_type = mg_get_builtin_mime_type(path);
        range._8_8_ = strlen(mime_type);
        goto LAB_00110a3e;
      }
      iVar3 = mg_strncasecmp(path + (sVar4 - gz_path._8_8_),(char *)gz_path._0_8_,gz_path._8_8_);
    } while (iVar3 != 0);
    mime_type = (char *)CONCAT71(range._1_7_,range[0]);
  }
  else {
    range._8_8_ = strlen(mime_type);
  }
LAB_00110a3e:
  pcVar8 = (char *)(filep->stat).size;
  if ((long)pcVar8 < 0) {
    pcVar7 = "Error: File size is too large to send\n%ld";
LAB_00110ad4:
    mg_send_http_error(conn,500,pcVar7,pcVar8);
  }
  else {
    conn->status_code = 200;
    range[0] = '\0';
    local_1180 = range._8_8_;
    local_1178 = mg_get_header(conn,"Range");
    if ((filep->stat).is_gzipped == 0) {
      if (((pcVar8 < (char *)0x400) || (conn->accept_gzip == 0)) || (local_1178 != (char *)0x0)) {
        local_11a8 = (char *)0x0;
      }
      else {
        local_11a8 = (char *)0x0;
        filep_01 = (mg_file *)0x1000;
        mg_snprintf(conn,&truncated,gz_path,0x1000,"%s.gz",path);
        if (truncated == 0) {
          iVar3 = mg_stat((mg_connection *)gz_path,lm,filep_02);
          local_11a8 = (char *)0x0;
          if ((iVar3 != 0) && (lm._16_4_ == 0)) {
            lm[0x14] = '\x01';
            lm[0x15] = '\0';
            lm[0x16] = '\0';
            lm[0x17] = '\0';
            (filep->stat).size = lm._0_8_;
            (filep->stat).last_modified = lm._8_8_;
            (filep->stat).is_directory = 0;
            (filep->stat).is_gzipped = 1;
            *(undefined8 *)&(filep->stat).location = lm._24_8_;
            pcVar8 = (char *)(filep->stat).size;
            local_11a8 = "gzip";
            filep_01 = filep;
            path = gz_path;
          }
        }
      }
    }
    else {
      filep_01 = (mg_file *)0x1000;
      mg_snprintf(conn,&truncated,gz_path,0x1000,"%s.gz",path);
      if (truncated != 0) {
        pcVar7 = "Error: Path of zipped file too long (%s)";
        pcVar8 = path;
        goto LAB_00110ad4;
      }
      local_11a8 = "gzip";
      path = (char *)gz_path;
    }
    iVar3 = mg_fopen((mg_connection *)path,(char *)0x1,(int)filep,filep_01);
    if (iVar3 == 0) {
      piVar5 = __errno_location();
      pcVar8 = strerror(*piVar5);
      mg_send_http_error(conn,500,"Error: Cannot open file\nfopen(%s): %s",path,pcVar8);
    }
    else {
      filep_00 = &filep->access;
      fclose_on_exec(filep_00,conn);
      r2 = 0;
      r1 = 0;
      t = extraout_RDX;
      if (local_1178 != (char *)0x0) {
        iVar3 = __isoc99_sscanf(local_1178,"bytes=%ld-%ld",&r1,&r2);
        t = (time_t *)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),-1 < r1 && 0 < iVar3);
        if (-1 < r2 && (-1 < r1 && 0 < iVar3)) {
          if ((filep->stat).is_gzipped != 0) {
            mg_send_http_error(conn,0x1a0,"%s",
                               "Error: Range requests in gzipped files are not supported");
            if ((FILE *)filep_00->fp != (FILE *)0x0) {
              fclose((FILE *)filep_00->fp);
            }
            filep_00->fp = (FILE *)0x0;
            return;
          }
          conn->status_code = 0xce;
          if (iVar3 == 2) {
            if (r2 < (long)pcVar8) {
              pcVar8 = (char *)r2;
            }
            pcVar8 = pcVar8 + (1 - r1);
          }
          else {
            pcVar8 = pcVar8 + -r1;
          }
          mg_snprintf(conn,(int *)0x0,range,0x80,"bytes %ld-%ld/%ld",r1,pcVar8 + r1 + -1,
                      (filep->stat).size);
          t = extraout_RDX_01;
        }
      }
      gmt_time_string(lm,(size_t)&(filep->stat).last_modified,t);
      mg_snprintf((mg_connection *)0x0,(int *)0x0,etag,0x40,"\"%lx.%ld\"",
                  (filep->stat).last_modified,(filep->stat).size);
      mg_response_header_start(conn,conn->status_code);
      send_no_cache_header(conn);
      pcVar7 = conn->dom_ctx->config[0x38];
      if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
        mg_response_header_add_lines(conn,pcVar7);
      }
      send_cors_header(conn);
      mg_response_header_add(conn,"Content-Type",mime_type,(int)local_1180);
      mg_response_header_add(conn,"Last-Modified",lm,-1);
      mg_response_header_add(conn,"Etag",etag,-1);
      trunc = 0;
      iVar3 = 0x12c413;
      mg_snprintf(conn,&trunc,len,0x20,"%ld",pcVar8);
      if (trunc == 0) {
        mg_response_header_add(conn,"Content-Length",len,-1);
      }
      mg_response_header_add(conn,"Accept-Ranges","bytes",-1);
      if (local_11a8 != (char *)0x0) {
        mg_response_header_add(conn,"Content-Encoding",local_11a8,-1);
      }
      if (range[0] != '\0') {
        mg_response_header_add(conn,"Content-Range",range,-1);
      }
      if ((local_1170 != (char *)0x0) && (*local_1170 != '\0')) {
        mg_response_header_add_lines(conn,local_1170);
      }
      mg_response_header_send(conn);
      if (iVar2 != 0) {
        send_file_data(conn,filep,r1,(int64_t)pcVar8,iVar3);
      }
      if ((FILE *)filep_00->fp != (FILE *)0x0) {
        fclose((FILE *)filep_00->fp);
      }
      filep_00->fp = (FILE *)0x0;
    }
  }
  return;
}

Assistant:

static void
handle_static_file_request(struct mg_connection *conn,
                           const char *path,
                           struct mg_file *filep,
                           const char *mime_type,
                           const char *additional_headers)
{
	char lm[64], etag[64];
	char range[128]; /* large enough, so there will be no overflow */
	const char *range_hdr;
	int64_t cl, r1, r2;
	struct vec mime_vec;
	int n, truncated;
	char gz_path[UTF8_PATH_MAX];
	const char *encoding = 0;
	int is_head_request;

#if defined(USE_ZLIB)
	/* Compression is allowed, unless there is a reason not to use
	 * compression. If the file is already compressed, too small or a
	 * "range" request was made, on the fly compression is not possible. */
	int allow_on_the_fly_compression = 1;
#endif

	if ((conn == NULL) || (conn->dom_ctx == NULL) || (filep == NULL)) {
		return;
	}

	is_head_request = !strcmp(conn->request_info.request_method, "HEAD");

	if (mime_type == NULL) {
		get_mime_type(conn, path, &mime_vec);
	} else {
		mime_vec.ptr = mime_type;
		mime_vec.len = strlen(mime_type);
	}
	if (filep->stat.size > INT64_MAX) {
		mg_send_http_error(conn,
		                   500,
		                   "Error: File size is too large to send\n%" INT64_FMT,
		                   filep->stat.size);
		return;
	}
	cl = (int64_t)filep->stat.size;
	conn->status_code = 200;
	range[0] = '\0';

#if defined(USE_ZLIB)
	/* if this file is in fact a pre-gzipped file, rewrite its filename
	 * it's important to rewrite the filename after resolving
	 * the mime type from it, to preserve the actual file's type */
	if (!conn->accept_gzip) {
		allow_on_the_fly_compression = 0;
	}
#endif

	/* Check if there is a range header */
	range_hdr = mg_get_header(conn, "Range");

	/* For gzipped files, add *.gz */
	if (filep->stat.is_gzipped) {
		mg_snprintf(conn, &truncated, gz_path, sizeof(gz_path), "%s.gz", path);

		if (truncated) {
			mg_send_http_error(conn,
			                   500,
			                   "Error: Path of zipped file too long (%s)",
			                   path);
			return;
		}

		path = gz_path;
		encoding = "gzip";

#if defined(USE_ZLIB)
		/* File is already compressed. No "on the fly" compression. */
		allow_on_the_fly_compression = 0;
#endif
	} else if ((conn->accept_gzip) && (range_hdr == NULL)
	           && (filep->stat.size >= MG_FILE_COMPRESSION_SIZE_LIMIT)) {
		struct mg_file_stat file_stat;

		mg_snprintf(conn, &truncated, gz_path, sizeof(gz_path), "%s.gz", path);

		if (!truncated && mg_stat(conn, gz_path, &file_stat)
		    && !file_stat.is_directory) {
			file_stat.is_gzipped = 1;
			filep->stat = file_stat;
			cl = (int64_t)filep->stat.size;
			path = gz_path;
			encoding = "gzip";

#if defined(USE_ZLIB)
			/* File is already compressed. No "on the fly" compression. */
			allow_on_the_fly_compression = 0;
#endif
		}
	}

	if (!mg_fopen(conn, path, MG_FOPEN_MODE_READ, filep)) {
		mg_send_http_error(conn,
		                   500,
		                   "Error: Cannot open file\nfopen(%s): %s",
		                   path,
		                   strerror(ERRNO));
		return;
	}

	fclose_on_exec(&filep->access, conn);

	/* If "Range" request was made: parse header, send only selected part
	 * of the file. */
	r1 = r2 = 0;
	if ((range_hdr != NULL)
	    && ((n = parse_range_header(range_hdr, &r1, &r2)) > 0) && (r1 >= 0)
	    && (r2 >= 0)) {
		/* actually, range requests don't play well with a pre-gzipped
		 * file (since the range is specified in the uncompressed space) */
		if (filep->stat.is_gzipped) {
			mg_send_http_error(
			    conn,
			    416, /* 416 = Range Not Satisfiable */
			    "%s",
			    "Error: Range requests in gzipped files are not supported");
			(void)mg_fclose(
			    &filep->access); /* ignore error on read only file */
			return;
		}
		conn->status_code = 206;
		cl = (n == 2) ? (((r2 > cl) ? cl : r2) - r1 + 1) : (cl - r1);
		mg_snprintf(conn,
		            NULL, /* range buffer is big enough */
		            range,
		            sizeof(range),
		            "bytes "
		            "%" INT64_FMT "-%" INT64_FMT "/%" INT64_FMT,
		            r1,
		            r1 + cl - 1,
		            filep->stat.size);

#if defined(USE_ZLIB)
		/* Do not compress ranges. */
		allow_on_the_fly_compression = 0;
#endif
	}

	/* Do not compress small files. Small files do not benefit from file
	 * compression, but there is still some overhead. */
#if defined(USE_ZLIB)
	if (filep->stat.size < MG_FILE_COMPRESSION_SIZE_LIMIT) {
		/* File is below the size limit. */
		allow_on_the_fly_compression = 0;
	}
#endif

	/* Prepare Etag, and Last-Modified headers. */
	gmt_time_string(lm, sizeof(lm), &filep->stat.last_modified);
	construct_etag(etag, sizeof(etag), &filep->stat);

	/* Create 2xx (200, 206) response */
	mg_response_header_start(conn, conn->status_code);
	send_static_cache_header(conn);
	send_additional_header(conn);
	send_cors_header(conn);
	mg_response_header_add(conn,
	                       "Content-Type",
	                       mime_vec.ptr,
	                       (int)mime_vec.len);
	mg_response_header_add(conn, "Last-Modified", lm, -1);
	mg_response_header_add(conn, "Etag", etag, -1);

#if defined(USE_ZLIB)
	/* On the fly compression allowed */
	if (allow_on_the_fly_compression) {
		/* For on the fly compression, we don't know the content size in
		 * advance, so we have to use chunked encoding */
		encoding = "gzip";
		if (conn->protocol_type == PROTOCOL_TYPE_HTTP1) {
			/* HTTP/2 is always using "chunks" (frames) */
			mg_response_header_add(conn, "Transfer-Encoding", "chunked", -1);
		}

	} else
#endif
	{
		/* Without on-the-fly compression, we know the content-length
		 * and we can use ranges (with on-the-fly compression we cannot).
		 * So we send these response headers only in this case. */
		char len[32];
		int trunc = 0;
		mg_snprintf(conn, &trunc, len, sizeof(len), "%" INT64_FMT, cl);

		if (!trunc) {
			mg_response_header_add(conn, "Content-Length", len, -1);
		}

		mg_response_header_add(conn, "Accept-Ranges", "bytes", -1);
	}

	if (encoding) {
		mg_response_header_add(conn, "Content-Encoding", encoding, -1);
	}
	if (range[0] != 0) {
		mg_response_header_add(conn, "Content-Range", range, -1);
	}

	/* The code above does not add any header starting with X- to make
	 * sure no one of the additional_headers is included twice */
	if ((additional_headers != NULL) && (*additional_headers != 0)) {
		mg_response_header_add_lines(conn, additional_headers);
	}

	/* Send all headers */
	mg_response_header_send(conn);

	if (!is_head_request) {
#if defined(USE_ZLIB)
		if (allow_on_the_fly_compression) {
			/* Compress and send */
			send_compressed_data(conn, filep);
		} else
#endif
		{
			/* Send file directly */
			send_file_data(conn, filep, r1, cl, 0); /* send static file */
		}
	}
	(void)mg_fclose(&filep->access); /* ignore error on read only file */
}